

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphml.hpp
# Opt level: O3

void __thiscall bal::GraphMLStreamWriter::write_header(GraphMLStreamWriter *this,Cnf *value)

{
  ostream *poVar1;
  
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<?xml version=\"1.0\" encoding=\"UTF-8\"?>",0x26);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">"
             ,0xde);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<graph id=\"CNF\" edgedefault=\"undirected\">",0x29);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>"
             ,0x53);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>"
             ,0x52);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>",
             0x4c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = (this->super_StreamWriter<bal::Cnf>).stream_;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>",
             0x43);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

virtual void write_header(const Cnf& value) {
            stream() << "<?xml version=\"1.0\" encoding=\"UTF-8\"?>" << std::endl;
            stream() << "<graphml xmlns=\"http://graphml.graphdrawing.org/xmlns\" xmlns:xsi=\"http://www.w3.org/2001/XMLSchema-instance\" xsi:schemaLocation=\"http://graphml.graphdrawing.org/xmlns http://graphml.graphdrawing.org/xmlns/1.0/graphml.xsd\">" << std::endl;
            stream() << "<graph id=\"CNF\" edgedefault=\"undirected\">" << std::endl;
            stream() << "<key id=\"n_variable_name\" for=\"node\" attr.name=\"variable_name\" attr.type=\"string\"/>" << std::endl;
            stream() << "<key id=\"n_variable_index\" for=\"node\" attr.name=\"variable_index\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_variable_id\" for=\"node\" attr.name=\"variable_id\" attr.type=\"int\"/>" << std::endl;
            stream() << "<key id=\"n_label\" for=\"node\" attr.name=\"label\" attr.type=\"string\"/>" << std::endl;
        }